

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Abc_Cex_t * Vta_ManRefineAbstraction(Vta_Man_t *p,int f)

{
  int iVar1;
  int iVar2;
  Vta_Obj_t *pVVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  undefined8 uVar7;
  bool bVar8;
  Vta_Man_t *p_00;
  int iVar9;
  uint uVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  uint *puVar13;
  void *pvVar14;
  Vec_Int_t *p_01;
  int *piVar15;
  Vta_Obj_t *pVVar16;
  Vta_Obj_t *pVVar17;
  Vta_Obj_t *pVVar18;
  Abc_Cex_t *pAVar19;
  size_t sVar20;
  size_t sVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  size_t __nmemb;
  long lVar26;
  Vta_Obj_t *local_80;
  Vta_Obj_t *local_78;
  Vta_Obj_t *local_70;
  uint *local_68;
  uint *local_60;
  Vta_Obj_t *local_58;
  Vta_Obj_t *local_50;
  Vec_Int_t *local_48;
  size_t local_40;
  Vta_Man_t *local_38;
  
  pVVar11 = Vta_ManCollectNodes(p,f);
  uVar25 = pVVar11->nSize;
  uVar22 = (ulong)uVar25;
  pVVar17 = local_78;
  pVVar16 = local_80;
  if (0 < (int)uVar25) {
    lVar12 = 0;
    do {
      uVar25 = (uint)uVar22;
      iVar9 = pVVar11->pArray[lVar12];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0061ae87;
      if (iVar9 == 0) {
        pVVar18 = (Vta_Obj_t *)0x0;
      }
      else {
        pVVar18 = p->pObjs + iVar9;
      }
      if (pVVar18 == (Vta_Obj_t *)0x0) break;
      if ((pVVar18->iObj < 0) || (p->pGia->nObjs <= pVVar18->iObj)) goto LAB_0061aeb7;
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) break;
      uVar25 = *(uint *)&pVVar18->field_0xc;
      *(uint *)&pVVar18->field_0xc = uVar25 | 0xfffffff;
      pVVar3 = p->pObjs;
      if ((pVVar18 <= pVVar3) || (pVVar3 + p->nObjs <= pVVar18)) goto LAB_0061b019;
      uVar10 = (uint)((ulong)((long)pVVar18 - (long)pVVar3) >> 4);
      if (((int)uVar10 < 0) || (p->pSat->size <= (int)uVar10)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                      ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
      }
      *(uint *)&pVVar18->field_0xc =
           (uVar25 & 0x4fffffff | 0xfffffff) +
           (uint)(p->pSat->model[uVar10 & 0x7fffffff] == 1) * 0x10000000 + 0x10000000;
      lVar12 = lVar12 + 1;
      uVar25 = pVVar11->nSize;
      uVar22 = (ulong)(int)uVar25;
    } while (lVar12 < (long)uVar22);
  }
  if (0 < (int)uVar25) {
    lVar12 = (long)pVVar11->pArray[(ulong)uVar25 - 1];
    if ((-1 < lVar12) && (pVVar11->pArray[(ulong)uVar25 - 1] < p->nObjs)) {
      *(uint *)&p->pObjs[lVar12].field_0xc = (*(uint *)&p->pObjs[lVar12].field_0xc & 0xf0000000) + 1
      ;
      puVar13 = (uint *)malloc(0x10);
      puVar13[0] = 0x3f7;
      puVar13[1] = 0;
      pvVar14 = malloc(0x1fb8);
      *(void **)(puVar13 + 2) = pvVar14;
      local_60 = puVar13;
      puVar13 = (uint *)malloc(0x10);
      puVar13[0] = 0x3f8;
      puVar13[1] = 0;
      pvVar14 = malloc(0x1fc0);
      *(void **)(puVar13 + 2) = pvVar14;
      lVar12 = (long)pVVar11->nSize;
      local_68 = puVar13;
      if (0 < lVar12) {
        do {
          pVVar16 = local_80;
          pVVar17 = local_78;
          if (pVVar11->nSize < lVar12) goto LAB_0061aeff;
          iVar9 = pVVar11->pArray[lVar12 + -1];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0061ae87;
          if (iVar9 == 0) {
            pVVar18 = (Vta_Obj_t *)0x0;
          }
          else {
            pVVar18 = p->pObjs + iVar9;
          }
          if (pVVar18 == (Vta_Obj_t *)0x0) break;
          iVar9 = pVVar18->iObj;
          if (((long)iVar9 < 0) || (pGVar4 = p->pGia, pGVar4->nObjs <= iVar9)) goto LAB_0061aeb7;
          if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
          uVar25 = *(uint *)&pVVar18->field_0xc;
          if ((uVar25 & 0xfffffff) == 0xfffffff) {
            __assert_fail("pThis->Prio < VTA_LARGE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x280,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          pGVar5 = pGVar4->pObjs + iVar9;
          uVar22 = *(ulong *)pGVar5;
          if ((~uVar22 & 0x1fffffff1fffffff) == 0) {
LAB_00619dbc:
            *(uint *)&pVVar18->field_0xc = uVar25 & 0xf0000000;
          }
          else {
            uVar10 = (uint)uVar22;
            uVar23 = (uint)(uVar22 >> 0x20);
            if (((uVar10 & 0x9fffffff) == 0x9fffffff) &&
               ((int)(uVar23 & 0x1fffffff) < pGVar4->vCis->nSize - pGVar4->nRegs))
            goto LAB_00619dbc;
            if (((int)uVar10 < 0 || (~uVar10 & 0x1fffffff) == 0) &&
               (((uVar10 & 0x9fffffff) != 0x9fffffff ||
                ((int)(uVar23 & 0x1fffffff) < pGVar4->vCis->nSize - pGVar4->nRegs)))) {
              __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x288,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            if ((uVar25 >> 0x1e & 1) == 0) {
              if ((uVar25 & 0xfffffff) == 0) {
                __assert_fail("pThis->Prio > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x28b,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              iVar9 = Vta_ManObjIsUsed(p,iVar9);
              if (iVar9 == 0) {
                lVar26 = (long)(int)local_68[1];
                uVar25 = *local_68;
                puVar13 = local_68;
                if (local_68[1] == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (*(void **)(local_68 + 2) == (void *)0x0) {
                      pvVar14 = malloc(0x80);
                    }
                    else {
                      pvVar14 = realloc(*(void **)(local_68 + 2),0x80);
                    }
                    uVar10 = 0x10;
                    puVar13 = local_68;
                  }
                  else {
                    uVar10 = uVar25 * 2;
                    if ((int)uVar10 <= (int)uVar25) goto LAB_00619fcd;
                    if (*(void **)(local_68 + 2) == (void *)0x0) {
                      pvVar14 = malloc((ulong)uVar25 << 4);
                      puVar13 = local_68;
                    }
                    else {
                      pvVar14 = realloc(*(void **)(local_68 + 2),(ulong)uVar25 << 4);
                      puVar13 = local_68;
                    }
                  }
                  goto LAB_00619fc6;
                }
              }
              else {
                lVar26 = (long)(int)local_60[1];
                uVar25 = *local_60;
                puVar13 = local_60;
                if (local_60[1] == uVar25) {
                  if ((int)uVar25 < 0x10) {
                    if (*(void **)(local_60 + 2) == (void *)0x0) {
                      pvVar14 = malloc(0x80);
                    }
                    else {
                      pvVar14 = realloc(*(void **)(local_60 + 2),0x80);
                    }
                    uVar10 = 0x10;
                    puVar13 = local_60;
                  }
                  else {
                    uVar10 = uVar25 * 2;
                    if ((int)uVar10 <= (int)uVar25) goto LAB_00619fcd;
                    if (*(void **)(local_60 + 2) == (void *)0x0) {
                      pvVar14 = malloc((ulong)uVar25 << 4);
                      puVar13 = local_60;
                    }
                    else {
                      pvVar14 = realloc(*(void **)(local_60 + 2),(ulong)uVar25 << 4);
                      puVar13 = local_60;
                    }
                  }
LAB_00619fc6:
                  *(void **)(puVar13 + 2) = pvVar14;
                  *puVar13 = uVar10;
                }
              }
LAB_00619fcd:
              puVar13[1] = (int)lVar26 + 1;
              *(Vta_Obj_t **)(*(long *)(puVar13 + 2) + lVar26 * 8) = pVVar18;
            }
            else {
              Vta_ObjPreds(p,pVVar18,pGVar5,&local_78,&local_80);
              if (local_78 != (Vta_Obj_t *)0x0) {
                uVar10 = *(uint *)&local_78->field_0xc & 0xfffffff;
                uVar25 = (*(uint *)&pVVar18->field_0xc & 0xfffffff) + 1;
                if (uVar10 < uVar25) {
                  uVar25 = uVar10;
                }
                *(uint *)&local_78->field_0xc = *(uint *)&local_78->field_0xc & 0xf0000000 | uVar25;
              }
              if (local_80 != (Vta_Obj_t *)0x0) {
                uVar10 = *(uint *)&local_80->field_0xc & 0xfffffff;
                uVar25 = (*(uint *)&pVVar18->field_0xc & 0xfffffff) + 1;
                if (uVar10 < uVar25) {
                  uVar25 = uVar10;
                }
                *(uint *)&local_80->field_0xc = *(uint *)&local_80->field_0xc & 0xf0000000 | uVar25;
              }
            }
          }
          bVar8 = 1 < lVar12;
          lVar12 = lVar12 + -1;
        } while (bVar8);
      }
      uVar25 = local_60[1];
      __nmemb = (size_t)(int)uVar25;
      if (0 < (long)__nmemb) {
        lVar12 = *(long *)(local_60 + 2);
        sVar20 = 0;
        do {
          puVar13 = *(uint **)(lVar12 + sVar20 * 8);
          puVar13[3] = puVar13[3] & 0xf0000000 | *puVar13 & 0xfffffff;
          sVar20 = sVar20 + 1;
        } while (__nmemb != sVar20);
      }
      uVar10 = local_68[1];
      sVar20 = (size_t)(int)uVar10;
      if (0 < (long)sVar20) {
        lVar12 = *(long *)(local_68 + 2);
        sVar21 = 0;
        do {
          puVar13 = *(uint **)(lVar12 + sVar21 * 8);
          puVar13[3] = puVar13[3] & 0xf0000000 | *puVar13 & 0xfffffff;
          sVar21 = sVar21 + 1;
        } while (sVar20 != sVar21);
      }
      if (1 < (int)uVar25) {
        qsort(*(void **)(local_60 + 2),__nmemb,8,Vta_ManComputeDepthIncrease);
      }
      if (1 < (int)uVar10) {
        qsort(*(void **)(local_68 + 2),sVar20,8,Vta_ManComputeDepthIncrease);
      }
      if (1 < (int)uVar25) {
        local_78 = (Vta_Obj_t *)**(long **)(local_60 + 2);
        local_80 = (Vta_Obj_t *)(*(long **)(local_60 + 2))[__nmemb - 1];
        if ((*(uint *)&local_80->field_0xc & 0xfffffff) <
            (*(uint *)&local_78->field_0xc & 0xfffffff)) {
          __assert_fail("pThis0->Prio <= pThis1->Prio",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x2ca,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
      }
      if ((int)uVar25 < 1) {
        iVar9 = 1;
      }
      else {
        lVar12 = *(long *)(local_60 + 2);
        sVar21 = 0;
        do {
          lVar26 = *(long *)(lVar12 + sVar21 * 8);
          sVar21 = sVar21 + 1;
          *(uint *)(lVar26 + 0xc) = *(uint *)(lVar26 + 0xc) & 0xf0000000 | (uint)sVar21 & 0xfffffff;
        } while (__nmemb != sVar21);
        iVar9 = (uint)sVar21 + 1;
      }
      if (0 < (int)uVar10) {
        lVar12 = *(long *)(local_68 + 2);
        sVar21 = 0;
        do {
          lVar26 = *(long *)(lVar12 + sVar21 * 8);
          *(uint *)(lVar26 + 0xc) =
               *(uint *)(lVar26 + 0xc) & 0xf0000000 | iVar9 + (int)sVar21 & 0xfffffffU;
          sVar21 = sVar21 + 1;
        } while (sVar20 != sVar21);
      }
      uVar25 = pVVar11->nSize;
      uVar22 = (ulong)uVar25;
      pVVar17 = local_78;
      pVVar16 = local_80;
      local_48 = pVVar11;
      if (0 < (int)uVar25) {
        lVar12 = 0;
        local_40 = __nmemb;
        local_38 = p;
        do {
          p_00 = local_38;
          uVar25 = (uint)uVar22;
          iVar9 = pVVar11->pArray[lVar12];
          if (((long)iVar9 < 0) || (local_38->nObjs <= iVar9)) goto LAB_0061ae87;
          if (iVar9 == 0) {
            pVVar18 = (Vta_Obj_t *)0x0;
          }
          else {
            pVVar18 = local_38->pObjs + iVar9;
          }
          p = local_38;
          if (pVVar18 == (Vta_Obj_t *)0x0) break;
          iVar9 = pVVar18->iObj;
          if ((long)iVar9 < 0) goto LAB_0061aeb7;
          pGVar4 = local_38->pGia;
          iVar1 = pGVar4->nObjs;
          if (iVar1 <= iVar9) goto LAB_0061aeb7;
          pGVar5 = pGVar4->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar25 = *(uint *)&pVVar18->field_0xc;
          if ((int)uVar25 < 0) {
            local_80 = pVVar16;
            local_78 = pVVar17;
            __assert_fail("pThis->fVisit == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2d8,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          if ((~uVar25 & 0xfffffff) == 0) {
            local_80 = pVVar16;
            local_78 = pVVar17;
            __assert_fail("pThis->Prio < VTA_LARGE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2d9,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          if (0x3fffffff < uVar25) {
            if ((uVar25 & 0x30000000) == 0) {
              local_80 = pVVar16;
              local_78 = pVVar17;
              __assert_fail("pThis->Value != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x2de,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            pGVar6 = pGVar5 + iVar9;
            uVar22 = *(ulong *)pGVar6;
            uVar10 = (uint)uVar22;
            if ((~uVar10 & 0x1fffffff) == 0 || (int)uVar10 < 0) {
              if (((uVar10 & 0x9fffffff) == 0x9fffffff) &&
                 (uVar10 = (uint)(uVar22 >> 0x20),
                 pGVar4->vCis->nSize - pGVar4->nRegs <= (int)(uVar10 & 0x1fffffff))) {
                if (pVVar18->iFrame < 1) {
                  uVar25 = uVar25 & 0x70000000;
                }
                else {
                  uVar10 = uVar10 & 0x1fffffff;
                  iVar9 = pGVar4->vCis->nSize;
                  if ((int)uVar10 < iVar9 - pGVar4->nRegs) goto LAB_0061b3d3;
                  iVar2 = pGVar4->vCos->nSize;
                  uVar10 = (iVar2 - iVar9) + uVar10;
                  if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_0061aeff;
                  iVar9 = pGVar4->vCos->pArray[uVar10];
                  if (((long)iVar9 < 0) || (iVar1 <= iVar9)) goto LAB_0061aeb7;
                  pVVar17 = Vga_ManFind(local_38,iVar9 - (*(uint *)(pGVar5 + iVar9) & 0x1fffffff),
                                        pVVar18->iFrame + -1);
                  if (pVVar17 == (Vta_Obj_t *)0x0) {
                    local_80 = pVVar16;
                    local_78 = pVVar17;
                    __assert_fail("pThis0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                  ,0x2fc,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                  }
                  uVar25 = *(uint *)&pVVar18->field_0xc & 0xf0000000 |
                           *(uint *)&pVVar17->field_0xc & 0xfffffff;
                }
              }
              else {
                if ((~uVar22 & 0x1fffffff1fffffff) != 0) {
                  local_80 = pVVar16;
                  local_78 = pVVar17;
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x305,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                uVar25 = uVar25 & 0x70000000;
              }
            }
            else {
              if (iVar1 <= iVar9) goto LAB_0061b125;
              local_50 = Vga_ManFind(local_38,iVar9 - (uVar10 & 0x1fffffff),pVVar18->iFrame);
              pGVar4 = p_00->pGia;
              pGVar5 = pGVar4->pObjs;
              pVVar17 = local_50;
              if ((pGVar6 < pGVar5) || (pGVar5 + pGVar4->nObjs <= pGVar6)) goto LAB_0061b125;
              pVVar16 = Vga_ManFind(p_00,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) *
                                         -0x55555555 - (*(uint *)&pGVar6->field_0x4 & 0x1fffffff),
                                    pVVar18->iFrame);
              if ((local_50 == (Vta_Obj_t *)0x0) || (pVVar16 == (Vta_Obj_t *)0x0)) {
                local_78 = local_50;
                local_80 = pVVar16;
                __assert_fail("pThis0 && pThis1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x2e4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              uVar10 = *(uint *)&pVVar18->field_0xc;
              uVar25 = uVar10 >> 0x1c & 3;
              pVVar17 = local_50;
              pVVar11 = local_48;
              if (uVar25 == 1) {
                uVar22 = *(ulong *)pGVar6;
                uVar23 = *(uint *)&local_50->field_0xc;
                uVar25 = uVar23 >> 0x1c & 3;
                uVar24 = (((uint)uVar22 >> 0x1d & 1) != 0) + 1;
                if (uVar25 == uVar24) {
                  if ((*(uint *)&pVVar16->field_0xc >> 0x1c & 3) ==
                      2 - ((uVar22 & 0x2000000000000000) == 0)) {
                    uVar25 = *(uint *)&pVVar16->field_0xc & 0xfffffff;
                    if ((uVar23 & 0xfffffff) < uVar25) {
                      uVar25 = uVar23 & 0xfffffff;
                    }
                    uVar25 = uVar10 & 0xf0000000 | uVar25;
                    goto LAB_0061a588;
                  }
                  if (uVar25 != uVar24) goto LAB_0061a54b;
                }
                else {
LAB_0061a54b:
                  uVar23 = *(uint *)&pVVar16->field_0xc;
                  if ((uVar23 >> 0x1c & 3) != 2 - ((uVar22 & 0x2000000000000000) == 0)) {
                    local_78 = local_50;
                    local_80 = pVVar16;
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                  ,0x2f2,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                  }
                }
                uVar25 = uVar10 & 0xf0000000 | uVar23 & 0xfffffff;
              }
              else {
                if (uVar25 != 2) {
                  local_78 = local_50;
                  local_80 = pVVar16;
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x2f4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                if (((*(uint *)&local_50->field_0xc >> 0x1c & 3) !=
                     2 - (((uint)*(ulong *)pGVar6 >> 0x1d & 1) != 0)) ||
                   ((*(uint *)&pVVar16->field_0xc >> 0x1c & 3) !=
                    ((*(ulong *)pGVar6 & 0x2000000000000000) == 0) + 1)) {
                  local_78 = local_50;
                  local_80 = pVVar16;
                  __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x2e7,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                uVar23 = *(uint *)&local_50->field_0xc & 0xfffffff;
                uVar25 = *(uint *)&pVVar16->field_0xc & 0xfffffff;
                if (uVar25 < uVar23) {
                  uVar25 = uVar23;
                }
                uVar25 = uVar10 & 0xf0000000 | uVar25;
              }
            }
LAB_0061a588:
            *(uint *)&pVVar18->field_0xc = uVar25;
            __nmemb = local_40;
          }
          lVar12 = lVar12 + 1;
          uVar25 = pVVar11->nSize;
          uVar22 = (ulong)(int)uVar25;
          p = local_38;
        } while (lVar12 < (long)uVar22);
      }
      local_80 = pVVar16;
      local_78 = pVVar17;
      if ((int)uVar25 < 1) goto LAB_0061b061;
      iVar9 = pVVar11->pArray[(ulong)uVar25 - 1];
      if ((-1 < (long)iVar9) && (iVar9 < p->nObjs)) {
        local_50 = (Vta_Obj_t *)&p->pObjs[iVar9].field_0xc;
        *(uint *)local_50 = *(uint *)local_50 | 0x80000000;
        p_01 = (Vec_Int_t *)malloc(0x10);
        p_01->nCap = 100;
        p_01->nSize = 0;
        piVar15 = (int *)malloc(400);
        p_01->pArray = piVar15;
        pVVar17 = local_78;
        pVVar16 = local_80;
        lVar12 = (long)pVVar11->nSize;
        if (0 < (long)pVVar11->nSize) {
LAB_0061a641:
          if (pVVar11->nSize < lVar12) {
LAB_0061aeff:
            local_78 = pVVar17;
            local_80 = pVVar16;
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar9 = pVVar11->pArray[lVar12 + -1];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0061ae87;
          if (iVar9 == 0) {
            pVVar18 = (Vta_Obj_t *)0x0;
          }
          else {
            pVVar18 = p->pObjs + iVar9;
          }
          if (pVVar18 != (Vta_Obj_t *)0x0) {
            iVar9 = pVVar18->iObj;
            if (((long)iVar9 < 0) || (p->pGia->nObjs <= iVar9)) goto LAB_0061aeb7;
            pGVar5 = p->pGia->pObjs;
            if (pGVar5 != (Gia_Obj_t *)0x0) {
              uVar25 = *(uint *)&pVVar18->field_0xc;
              if ((int)uVar25 < 0) {
                *(uint *)&pVVar18->field_0xc = uVar25 & 0x7fffffff;
                if ((local_50->iObj & 0xfffffffU) < (uVar25 & 0xfffffff)) {
                  local_80 = pVVar16;
                  local_78 = pVVar17;
                  __assert_fail("pThis->Prio >= 0 && pThis->Prio <= pTop->Prio",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x311,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                pGVar5 = pGVar5 + iVar9;
                pVVar11 = local_48;
                if ((uVar25 >> 0x1e & 1) == 0) {
                  uVar22 = *(ulong *)pGVar5;
                  uVar25 = (uint)uVar22;
                  if ((int)uVar25 < 0 || (~uVar25 & 0x1fffffff) == 0) {
                    pGVar4 = p->pGia;
                    uVar10 = (uint)(uVar22 >> 0x20);
                    if ((uVar25 & 0x9fffffff) == 0x9fffffff) {
                      if (((~uVar22 & 0x1fffffff1fffffff) != 0) &&
                         ((int)(uVar10 & 0x1fffffff) < pGVar4->vCis->nSize - pGVar4->nRegs)) {
LAB_0061a962:
                        if (((uVar25 & 0x9fffffff) != 0x9fffffff) ||
                           (pGVar4->vCis->nSize - pGVar4->nRegs <= (int)(uVar10 & 0x1fffffff))) {
                          local_80 = pVVar16;
                          local_78 = pVVar17;
                          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                        ,0x315,
                                        "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                        }
                      }
                    }
                    else if ((~uVar22 & 0x1fffffff1fffffff) != 0) goto LAB_0061a962;
                  }
                  pVVar3 = p->pObjs;
                  local_70 = pVVar16;
                  local_58 = pVVar17;
                  if ((pVVar18 <= pVVar3) || (pVVar3 + p->nObjs <= pVVar18)) goto LAB_0061b019;
                  Vec_IntPush(p_01,(int)((ulong)((long)pVVar18 - (long)pVVar3) >> 4));
                  pVVar17 = local_58;
                  pVVar16 = local_70;
                }
                else {
                  if ((uVar25 & 0x30000000) == 0) {
                    local_80 = pVVar16;
                    local_78 = pVVar17;
                    __assert_fail("pThis->Value != 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                  ,0x31a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                  }
                  uVar22 = *(ulong *)pGVar5;
                  uVar25 = (uint)uVar22;
                  pGVar4 = p->pGia;
                  if ((~uVar25 & 0x1fffffff) == 0 || (int)uVar25 < 0) {
                    if (((uVar25 & 0x9fffffff) == 0x9fffffff) &&
                       (uVar25 = (uint)(uVar22 >> 0x20),
                       pGVar4->vCis->nSize - pGVar4->nRegs <= (int)(uVar25 & 0x1fffffff))) {
                      if (0 < pVVar18->iFrame) {
                        uVar25 = uVar25 & 0x1fffffff;
                        iVar9 = pGVar4->vCis->nSize;
                        if ((int)uVar25 < iVar9 - pGVar4->nRegs) {
LAB_0061b3d3:
                          local_78 = pVVar17;
                          local_80 = pVVar16;
                          __assert_fail("Gia_ObjIsRo(p, pObj)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                        ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)")
                          ;
                        }
                        iVar1 = pGVar4->vCos->nSize;
                        uVar25 = (iVar1 - iVar9) + uVar25;
                        if (((int)uVar25 < 0) || (iVar1 <= (int)uVar25)) goto LAB_0061aeff;
                        iVar9 = pGVar4->vCos->pArray[uVar25];
                        local_70 = pVVar16;
                        if (((long)iVar9 < 0) || (pGVar4->nObjs <= iVar9)) goto LAB_0061aeb7;
                        pVVar17 = Vga_ManFind(p,iVar9 - (*(uint *)(pGVar4->pObjs + iVar9) &
                                                        0x1fffffff),pVVar18->iFrame + -1);
                        if (pVVar17 == (Vta_Obj_t *)0x0) {
                          local_80 = local_70;
                          local_78 = pVVar17;
                          __assert_fail("pThis0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                        ,0x352,
                                        "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                        }
                        uVar25 = *(uint *)&pVVar17->field_0xc;
                        *(uint *)&pVVar17->field_0xc = uVar25 | 0x80000000;
                        pVVar16 = local_70;
                        if (((uVar25 ^ *(uint *)&pVVar18->field_0xc) & 0xfffffff) != 0) {
                          local_80 = local_70;
                          local_78 = pVVar17;
                          __assert_fail("pThis0->Prio == pThis->Prio",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                        ,0x354,
                                        "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                        }
                      }
                    }
                    else if ((~uVar22 & 0x1fffffff1fffffff) != 0) {
                      local_80 = pVVar16;
                      local_78 = pVVar17;
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                    ,0x358,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                    }
                  }
                  else {
                    pGVar6 = pGVar4->pObjs;
                    local_70 = pVVar16;
                    if ((pGVar5 < pGVar6) || (pGVar6 + pGVar4->nObjs <= pGVar5)) {
LAB_0061b11b:
                      local_78 = pVVar17;
                      local_80 = local_70;
                      pVVar16 = local_80;
                      pVVar17 = local_78;
LAB_0061b125:
                      local_78 = pVVar17;
                      local_80 = pVVar16;
                      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                    }
                    local_58 = Vga_ManFind(p,(int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2) *
                                             -0x55555555 - (uVar25 & 0x1fffffff),pVVar18->iFrame);
                    pGVar6 = p->pGia->pObjs;
                    pVVar17 = local_58;
                    if ((pGVar5 < pGVar6) || (pGVar6 + p->pGia->nObjs <= pGVar5)) goto LAB_0061b11b;
                    pVVar16 = Vga_ManFind(p,(int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2) *
                                            -0x55555555 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff)
                                          ,pVVar18->iFrame);
                    if ((local_58 == (Vta_Obj_t *)0x0) || (pVVar16 == (Vta_Obj_t *)0x0)) {
                      local_78 = local_58;
                      local_80 = pVVar16;
                      __assert_fail("pThis0 && pThis1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                    ,800,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                    }
                    uVar25 = *(uint *)&pVVar18->field_0xc >> 0x1c & 3;
                    pVVar17 = local_58;
                    pVVar11 = local_48;
                    if (uVar25 == 1) {
                      uVar22 = *(ulong *)pGVar5;
                      uVar25 = *(uint *)&local_58->field_0xc;
                      uVar10 = uVar25 >> 0x1c & 3;
                      uVar23 = (((uint)uVar22 >> 0x1d & 1) != 0) + 1;
                      if (uVar10 == uVar23) {
                        uVar24 = *(uint *)&pVVar16->field_0xc;
                        if ((uVar24 >> 0x1c & 3) == 2 - ((uVar22 & 0x2000000000000000) == 0)) {
                          if (-1 < (int)(uVar24 | uVar25)) {
                            if ((uVar24 & 0xfffffff) < (uVar25 & 0xfffffff)) {
                              *(uint *)&pVVar16->field_0xc = uVar24 | 0x80000000;
                              if (((uVar24 ^ *(uint *)&pVVar18->field_0xc) & 0xfffffff) != 0) {
                                local_78 = local_58;
                                local_80 = pVVar16;
                                __assert_fail("pThis1->Prio == pThis->Prio",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                              ,0x33b,
                                              "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)"
                                             );
                              }
                            }
                            else {
                              *(uint *)&local_58->field_0xc = uVar25 | 0x80000000;
                              if (((uVar25 ^ *(uint *)&pVVar18->field_0xc) & 0xfffffff) != 0) {
                                local_78 = local_58;
                                local_80 = pVVar16;
                                __assert_fail("pThis0->Prio == pThis->Prio",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                              ,0x336,
                                              "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)"
                                             );
                              }
                            }
                          }
                        }
                        else {
                          if (uVar10 != uVar23) goto LAB_0061ab89;
                          *(uint *)&local_58->field_0xc = uVar25 | 0x80000000;
                          if (((uVar25 ^ *(uint *)&pVVar18->field_0xc) & 0xfffffff) != 0) {
                            local_78 = local_58;
                            local_80 = pVVar16;
                            __assert_fail("pThis0->Prio == pThis->Prio",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                          ,0x341,
                                          "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                          }
                        }
                      }
                      else {
LAB_0061ab89:
                        uVar25 = *(uint *)&pVVar16->field_0xc;
                        if ((uVar25 >> 0x1c & 3) != 2 - ((uVar22 & 0x2000000000000000) == 0)) {
                          local_78 = local_58;
                          local_80 = pVVar16;
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                        ,0x348,
                                        "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                        }
                        *(uint *)&pVVar16->field_0xc = uVar25 | 0x80000000;
                        if (((uVar25 ^ *(uint *)&pVVar18->field_0xc) & 0xfffffff) != 0) {
                          local_78 = local_58;
                          local_80 = pVVar16;
                          __assert_fail("pThis1->Prio == pThis->Prio",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                        ,0x346,
                                        "Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                        }
                      }
                    }
                    else {
                      if (uVar25 != 2) {
                        local_78 = local_58;
                        local_80 = pVVar16;
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                      ,0x34a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)"
                                     );
                      }
                      uVar25 = *(uint *)&local_58->field_0xc;
                      if (((uVar25 >> 0x1c & 3) != 2 - (((uint)*(ulong *)pGVar5 >> 0x1d & 1) != 0))
                         || ((*(uint *)&pVVar16->field_0xc >> 0x1c & 3) !=
                             ((*(ulong *)pGVar5 & 0x2000000000000000) == 0) + 1)) {
                        local_78 = local_58;
                        local_80 = pVVar16;
                        __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                      ,0x323,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)"
                                     );
                      }
                      uVar10 = *(uint *)&pVVar18->field_0xc & 0xfffffff;
                      if (uVar10 < (uVar25 & 0xfffffff)) {
                        local_78 = local_58;
                        local_80 = pVVar16;
                        __assert_fail("pThis0->Prio <= pThis->Prio",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                      ,0x324,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)"
                                     );
                      }
                      if (uVar10 < (*(uint *)&pVVar16->field_0xc & 0xfffffff)) {
                        local_78 = local_58;
                        local_80 = pVVar16;
                        __assert_fail("pThis1->Prio <= pThis->Prio",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                      ,0x325,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)"
                                     );
                      }
                      *(uint *)&local_58->field_0xc = uVar25 | 0x80000000;
                      pVVar16->field_0xf = pVVar16->field_0xf | 0x80;
                    }
                  }
                }
              }
              bVar8 = 1 < lVar12;
              lVar12 = lVar12 + -1;
              if (bVar8) goto LAB_0061a641;
            }
          }
        }
        local_80 = pVVar16;
        local_78 = pVVar17;
        if (p->pPars->fAddLayer != 0) {
          iVar9 = p_01->nSize;
          if (0 < (long)iVar9) {
            piVar15 = p_01->pArray;
            lVar12 = 0;
            do {
              iVar1 = piVar15[lVar12];
              if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0061ae87;
              if (iVar1 == 0) {
                pVVar18 = (Vta_Obj_t *)0x0;
              }
              else {
                pVVar18 = p->pObjs + iVar1;
              }
              if (pVVar18 == (Vta_Obj_t *)0x0) break;
              if ((int)*(uint *)&pVVar18->field_0xc < 0) {
                __assert_fail("pThis->fVisit == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x360,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              *(uint *)&pVVar18->field_0xc = *(uint *)&pVVar18->field_0xc | 0x80000000;
              lVar12 = lVar12 + 1;
            } while (iVar9 != lVar12);
          }
          if (0 < (int)__nmemb) {
            lVar12 = *(long *)(local_60 + 2);
            sVar20 = 0;
            do {
              pVVar18 = *(Vta_Obj_t **)(lVar12 + sVar20 * 8);
              if (-1 < *(int *)&pVVar18->field_0xc) {
                pVVar3 = p->pObjs;
                pVVar16 = local_80;
                pVVar17 = local_78;
                if ((pVVar18 <= pVVar3) || (pVVar3 + p->nObjs <= pVVar18)) {
LAB_0061b019:
                  local_78 = pVVar17;
                  local_80 = pVVar16;
                  __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x69,"int Vta_ObjId(Vta_Man_t *, Vta_Obj_t *)");
                }
                Vec_IntPush(p_01,(int)((ulong)((long)pVVar18 - (long)pVVar3) >> 4));
              }
              sVar20 = sVar20 + 1;
            } while (__nmemb != sVar20);
          }
          iVar9 = p_01->nSize;
          if (0 < (long)iVar9) {
            piVar15 = p_01->pArray;
            lVar12 = 0;
            do {
              iVar1 = piVar15[lVar12];
              pVVar16 = local_80;
              pVVar17 = local_78;
              if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0061ae87;
              if (iVar1 == 0) {
                pVVar17 = (Vta_Obj_t *)0x0;
              }
              else {
                pVVar17 = p->pObjs + iVar1;
              }
              if (pVVar17 == (Vta_Obj_t *)0x0) break;
              pVVar17->field_0xf = pVVar17->field_0xf & 0x7f;
              lVar12 = lVar12 + 1;
            } while (iVar9 != lVar12);
          }
        }
        if (*(void **)(local_60 + 2) != (void *)0x0) {
          free(*(void **)(local_60 + 2));
          local_60[2] = 0;
          local_60[3] = 0;
        }
        free(local_60);
        puVar13 = local_68;
        if (*(void **)(local_68 + 2) != (void *)0x0) {
          free(*(void **)(local_68 + 2));
          puVar13[2] = 0;
          puVar13[3] = 0;
        }
        free(puVar13);
        if ((local_50->iObj & 0xfffffffU) == 0) {
          pAVar19 = Vga_ManDeriveCex(p);
        }
        else {
          iVar9 = p_01->nSize;
          if (0 < (long)iVar9) {
            piVar15 = p_01->pArray;
            lVar12 = 0;
            do {
              iVar1 = piVar15[lVar12];
              pVVar16 = local_80;
              pVVar17 = local_78;
              if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0061ae87;
              if (iVar1 == 0) {
                pVVar18 = (Vta_Obj_t *)0x0;
              }
              else {
                pVVar18 = p->pObjs + iVar1;
              }
              if (pVVar18 == (Vta_Obj_t *)0x0) break;
              iVar1 = pVVar18->iObj;
              if (((long)iVar1 < 0) || (pGVar4 = p->pGia, pGVar4->nObjs <= iVar1)) {
LAB_0061aeb7:
                local_78 = pVVar17;
                local_80 = pVVar16;
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
              uVar7 = *(undefined8 *)(pGVar4->pObjs + iVar1);
              if ((((uint)uVar7 & 0x9fffffff) != 0x9fffffff) ||
                 (pGVar4->vCis->nSize - pGVar4->nRegs <=
                  (int)((uint)((ulong)uVar7 >> 0x20) & 0x1fffffff))) {
                Vga_ManAddClausesOne(p,iVar1,pVVar18->iFrame);
              }
              lVar12 = lVar12 + 1;
            } while (iVar9 != lVar12);
          }
          sat_solver2_simplify(p->pSat);
          pAVar19 = (Abc_Cex_t *)0x0;
        }
        p->nObjAdded = p->nObjAdded + p_01->nSize;
        if (p_01->pArray != (int *)0x0) {
          free(p_01->pArray);
          p_01->pArray = (int *)0x0;
        }
        free(p_01);
        return pAVar19;
      }
    }
LAB_0061ae87:
    local_78 = pVVar17;
    local_80 = pVVar16;
    __assert_fail("i >= 0 && i < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
  }
LAB_0061b061:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Vta_ManRefineAbstraction( Vta_Man_t * p, int f )
{
    int fVerify = 0;
    Abc_Cex_t * pCex = NULL;
    Vec_Int_t * vOrder, * vTermsToAdd;
    Vec_Ptr_t * vTermsUsed, * vTermsUnused;
    Vta_Obj_t * pThis, * pThis0, * pThis1, * pTop;
    Gia_Obj_t * pObj;
    int i, Counter;

    if ( fVerify )
    Vta_ManSatVerify( p );

    // collect nodes in a topological order
    vOrder = Vta_ManCollectNodes( p, f );
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        pThis->Prio = VTA_LARGE;
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
        pThis->fVisit = 0;
    }

    // verify
    if ( fVerify )
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fAdded )
            continue;
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) );
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            if ( pThis->iFrame == 0 )
                assert( pThis->Value == VTA_VAR0 );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) );
            else if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) );
            else assert( 0 );
        }
    }

    // compute distance in reverse order
    pThis = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pThis->Prio  = 1;
    // collect used and unused terms
    vTermsUsed   = Vec_PtrAlloc( 1015 );
    vTermsUnused = Vec_PtrAlloc( 1016 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        // there is no unreachable states
        assert( pThis->Prio < VTA_LARGE );
        // skip constants and PIs
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
        {
            pThis->Prio = 0; // set highest priority
            continue;
        }
        // collect terminals
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
        if ( !pThis->fAdded )
        {
            assert( pThis->Prio > 0 );
            if ( Vta_ManObjIsUsed(p, pThis->iObj) )
                Vec_PtrPush( vTermsUsed, pThis );
            else
                Vec_PtrPush( vTermsUnused, pThis );
            continue;
        }
        // propagate
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( pThis0 ) 
            pThis0->Prio = Abc_MinInt( pThis0->Prio, pThis->Prio + 1 );
        if ( pThis1 ) 
            pThis1->Prio = Abc_MinInt( pThis1->Prio, pThis->Prio + 1 );
    }

/*
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
        if ( pThis->Prio > 0 )
            pThis->Prio = 10;
*/
/*
    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
*/


    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = pThis->iObj;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = pThis->iObj;


    // objects with equal distance should receive priority based on number
    // those objects whose prototypes have been added in other timeframes
    // should have higher priority than the current object
    Vec_PtrSort( vTermsUsed,   (int (*)(void))Vta_ManComputeDepthIncrease );
    Vec_PtrSort( vTermsUnused, (int (*)(void))Vta_ManComputeDepthIncrease );
    if ( Vec_PtrSize(vTermsUsed) > 1 )
    {
        pThis0 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUsed, 0);
        pThis1 = (Vta_Obj_t *)Vec_PtrEntryLast(vTermsUsed);
        assert( pThis0->Prio <= pThis1->Prio );
    }
    // assign the priority based on these orders
    Counter = 1;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = Counter++;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = Counter++;
//    Abc_Print( 1, "Used %d  Unused %d\n", Vec_PtrSize(vTermsUsed), Vec_PtrSize(vTermsUnused) );


    // propagate in the direct order
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        assert( pThis->Prio < VTA_LARGE );
        // skip terminal objects
        if ( !pThis->fAdded )
            continue;
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                pThis->Prio = Abc_MaxInt( pThis0->Prio, pThis1->Prio );
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = Abc_MinInt( pThis0->Prio, pThis1->Prio ); // choice!!!
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Prio = pThis0->Prio;
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = pThis1->Prio;
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis->Prio = pThis0->Prio;
            }
            else
                pThis->Prio = 0;
        }
        else if ( Gia_ObjIsConst0(pObj) )
            pThis->Prio = 0;
        else
            assert( 0 );
    }

    // select important values
    pTop = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pTop->fVisit = 1;
    vTermsToAdd = Vec_IntAlloc( 100 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fVisit )
            continue;
        pThis->fVisit = 0;
        assert( pThis->Prio >= 0 && pThis->Prio <= pTop->Prio );
        // skip terminal objects
        if ( !pThis->fAdded )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) );
            Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
            continue;
        }
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                assert( pThis0->Prio <= pThis->Prio );
                assert( pThis1->Prio <= pThis->Prio );
                pThis0->fVisit = 1;
                pThis1->fVisit = 1;
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    if ( pThis0->fVisit )
                    {
                    }
                    else if ( pThis1->fVisit )
                    {
                    }
                    else if ( pThis0->Prio <= pThis1->Prio ) // choice!!!
                    {
                        pThis0->fVisit = 1;
                        assert( pThis0->Prio == pThis->Prio );
                    }
                    else
                    {
                        pThis1->fVisit = 1;
                        assert( pThis1->Prio == pThis->Prio );
                    }
                }
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                {
                    pThis0->fVisit = 1;
                    assert( pThis0->Prio == pThis->Prio );
                }
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    pThis1->fVisit = 1;
                    assert( pThis1->Prio == pThis->Prio );
                }
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis0->fVisit = 1;
                assert( pThis0->Prio == pThis->Prio );
            }
        }
        else if ( !Gia_ObjIsConst0(pObj) )
            assert( 0 );
    }

    if ( p->pPars->fAddLayer )
    {
        // mark those currently included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
        {
            assert( pThis->fVisit == 0 );
            pThis->fVisit = 1;
        }
        // add used terms, which have close relationship
        Counter = Vec_IntSize(vTermsToAdd);
        Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        {
            if ( pThis->fVisit )
                continue;
    //        Vta_ObjPreds( p, pThis, Gia_ManObj(p->pGia, pThis->iObj), &pThis0, &pThis1 );
    //        if ( (pThis0 && (pThis0->fAdded || pThis0->fVisit)) || (pThis1 && (pThis1->fAdded || pThis1->fVisit)) )
                Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
        }
        // remove those currenty included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
            pThis->fVisit = 0;
    }
//    printf( "\n%d -> %d\n", Counter, Vec_IntSize(vTermsToAdd) );
//Vec_IntReverseOrder( vTermsToAdd );
//Vec_IntSort( vTermsToAdd, 1 );


    // cleanup
    Vec_PtrFree( vTermsUsed );
    Vec_PtrFree( vTermsUnused );


    if ( fVerify )
    {
    // verify
    Vta_ManForEachObjVec( vOrder, p, pThis, i )
        pThis->Value = VTA_VARX;
    Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
    {
        assert( !pThis->fAdded );
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
    }
    // simulate 
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        if ( !pThis->fAdded )
            continue;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR1;
            else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR0;
            else
                pThis->Value = VTA_VARX;
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR0;
                else if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR1;
                else
                    pThis->Value = VTA_VARX;
            }
            else
            {
                pThis->Value = VTA_VAR0;
            }
        }
        else if ( Gia_ObjIsConst0(pObj) )
        {
            pThis->Value = VTA_VAR0;
        }
        else assert( 0 );
        // double check the solver
        assert( pThis->Value == VTA_VARX || (int)pThis->Value == (sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0) );
    }

    // check the output
    if ( !Vta_ValIs1(pTop, Gia_ObjFaninC0(Gia_ManPo(p->pGia, 0))) )
        Abc_Print( 1, "Vta_ManRefineAbstraction(): Terminary simulation verification failed!\n" );
//    else
//        Abc_Print( 1, "Verification OK.\n" );
    }


    // produce true counter-example
    if ( pTop->Prio == 0 )
        pCex = Vga_ManDeriveCex( p );
    else
    {
//       Vta_ManProfileAddition( p, vTermsToAdd );

        Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
            if ( !Gia_ObjIsPi(p->pGia, pObj) )
                Vga_ManAddClausesOne( p, pThis->iObj, pThis->iFrame );
        sat_solver2_simplify( p->pSat );
    }
    p->nObjAdded += Vec_IntSize(vTermsToAdd);
    Vec_IntFree( vTermsToAdd );
    return pCex;
}